

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O0

void KeccakP1600OnWords(tKeccakLane *state,uint nrRounds)

{
  uint uVar1;
  int in_ESI;
  uint i;
  uint in_stack_ffffffffffffffec;
  
  for (uVar1 = 0x18 - in_ESI; uVar1 < 0x18; uVar1 = uVar1 + 1) {
    KeccakP1600Round((tKeccakLane *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

void KeccakP1600OnWords(tKeccakLane *state, unsigned int nrRounds)
{
    unsigned int i;

#ifdef KeccakReference
    displayStateAsLanes(3, "Same, with lanes as 64-bit words", state, 1600);
#endif

    for(i=(maxNrRounds-nrRounds); i<maxNrRounds; i++)
        KeccakP1600Round(state, i);
}